

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O2

void __thiscall
QXmlStreamReaderPrivate::putString(QXmlStreamReaderPrivate *this,QStringView s,qsizetype from)

{
  ushort uVar1;
  long lVar2;
  uint *puVar3;
  long lVar4;
  storage_type_conflict *psVar5;
  qsizetype extraCapacity;
  const_reverse_iterator end;
  long lVar6;
  long in_FS_OFFSET;
  QStringView s_00;
  QStringView s_local;
  
  psVar5 = s.m_data;
  extraCapacity = s.m_size;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  s_local.m_size = extraCapacity;
  s_local.m_data = psVar5;
  if (from == 0) {
    QXmlStreamSimpleStack<unsigned_int>::reserve(&this->putStack,extraCapacity);
    puVar3 = (this->putStack).data;
    lVar4 = (this->putStack).tos;
    for (lVar6 = extraCapacity * 2; lVar4 = lVar4 + 1, lVar6 != 0; lVar6 = lVar6 + -2) {
      uVar1 = *(ushort *)((long)psVar5 + lVar6 + -2);
      (this->putStack).tos = lVar4;
      puVar3[lVar4] = (uint)uVar1;
    }
  }
  else {
    s_00 = QStringView::mid(&s_local,from,-1);
    putString(this,s_00,0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QXmlStreamReaderPrivate::putString(QStringView s, qsizetype from)
{
    if (from != 0) {
        putString(s.mid(from));
        return;
    }
    putStack.reserve(s.size());
    for (auto it = s.rbegin(), end = s.rend(); it != end; ++it)
        putStack.rawPush() = it->unicode();
}